

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::IsLaterStandard(cmMakefile *this,string *lang,string *lhs,string *rhs)

{
  bool bVar1;
  char **ppcVar2;
  string *this_00;
  cmStrCmp cStack_98;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  this_00 = (string *)&cStack_98;
  bVar1 = std::operator==(lang,"C");
  if (bVar1) {
    std::__cxx11::string::string(local_38,(string *)rhs);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_0059c038,(cmStrCmp *)local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::string(local_58,(string *)lhs);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                        (ppcVar2,(char **)&DAT_0059c038,(cmStrCmp *)local_58);
    bVar1 = ppcVar2 != (char **)&DAT_0059c038;
    this_00 = local_58;
  }
  else {
    std::__cxx11::string::string(local_78,(string *)rhs);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,
                         (cmStrCmp *)local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::string((string *)&cStack_98,(string *)lhs);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                        (ppcVar2,(char **)&cmMakefileTargetGenerator::vtable,&cStack_98);
    bVar1 = ppcVar2 != (char **)&cmMakefileTargetGenerator::vtable;
  }
  std::__cxx11::string::~string(this_00);
  return bVar1;
}

Assistant:

bool cmMakefile::IsLaterStandard(std::string const& lang,
                                 std::string const& lhs,
                                 std::string const& rhs)
{
  if (lang == "C")
    {
    const char * const *rhsIt = std::find_if(cmArrayBegin(C_STANDARDS),
                                            cmArrayEnd(C_STANDARDS),
                                            cmStrCmp(rhs));

    return std::find_if(rhsIt, cmArrayEnd(C_STANDARDS),
                        cmStrCmp(lhs)) != cmArrayEnd(C_STANDARDS);
    }
  const char * const *rhsIt = std::find_if(cmArrayBegin(CXX_STANDARDS),
                                           cmArrayEnd(CXX_STANDARDS),
                                           cmStrCmp(rhs));

  return std::find_if(rhsIt, cmArrayEnd(CXX_STANDARDS),
                      cmStrCmp(lhs)) != cmArrayEnd(CXX_STANDARDS);
}